

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blenders_intel.cpp
# Opt level: O2

void __thiscall
agge::simd::blender_solid_color::blender_solid_color
          (blender_solid_color *this,pixel components,uint8_t alpha)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  uint5 uVar13;
  undefined1 auVar14 [13];
  undefined1 auVar15 [13];
  unkuint9 Var16;
  undefined1 auVar17 [13];
  undefined1 auVar18 [13];
  undefined1 auVar19 [13];
  int iVar20;
  undefined7 in_register_00000011;
  undefined4 uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  
  iVar20 = (int)CONCAT71(in_register_00000011,alpha);
  auVar12[1] = 0;
  auVar12[0] = components.components[0];
  auVar9[0xc] = components.components[3];
  auVar9._0_12_ = ZEXT712(0);
  auVar10._11_2_ = auVar9._11_2_;
  auVar10._0_11_ = ZEXT711(0);
  auVar11._10_3_ = auVar10._10_3_;
  auVar11._0_10_ = (unkuint10)0;
  uVar13 = CONCAT41(auVar11._9_4_,components.components[2]);
  auVar17._5_8_ = 0;
  auVar17._0_5_ = uVar13;
  auVar14._6_7_ = 0;
  auVar14._0_6_ = SUB136(auVar17 << 0x40,7);
  auVar15._7_6_ = 0;
  auVar15._0_7_ = SUB137(auVar14 << 0x38,6);
  Var16 = CONCAT81(SUB138(auVar15 << 0x30,5),components.components[1]);
  auVar18._9_4_ = 0;
  auVar18._0_9_ = Var16;
  auVar19._10_3_ = 0;
  auVar19._0_10_ = SUB1310(auVar18 << 0x20,3);
  auVar12._2_11_ = SUB1311(auVar19 << 0x18,2);
  auVar22._4_4_ = (undefined4)Var16;
  auVar22._0_4_ = (int)uVar13;
  auVar22._8_4_ = auVar12._0_4_;
  auVar22[0xc] = components.components[3];
  auVar22._13_3_ = 0;
  auVar22 = pshufhw(auVar22,auVar22,0xec);
  auVar23._4_4_ = auVar22._4_4_;
  auVar23._12_4_ = auVar22._12_4_;
  auVar23._0_4_ = auVar22._8_4_;
  auVar23._8_4_ = auVar22._0_4_;
  auVar22 = pshuflw(auVar23,auVar23,0x6c);
  sVar1 = auVar22._0_2_;
  sVar2 = auVar22._2_2_;
  sVar3 = auVar22._4_2_;
  sVar4 = auVar22._6_2_;
  sVar5 = auVar22._8_2_;
  sVar6 = auVar22._10_2_;
  sVar7 = auVar22._12_2_;
  sVar8 = auVar22._14_2_;
  *(char *)this->_color_u16 = (0 < sVar1) * (sVar1 < 0x100) * auVar22[0] - (0xff < sVar1);
  *(char *)((long)this->_color_u16 + 1) =
       (0 < sVar2) * (sVar2 < 0x100) * auVar22[2] - (0xff < sVar2);
  *(char *)((long)this->_color_u16 + 2) =
       (0 < sVar3) * (sVar3 < 0x100) * auVar22[4] - (0xff < sVar3);
  *(char *)((long)this->_color_u16 + 3) =
       (0 < sVar4) * (sVar4 < 0x100) * auVar22[6] - (0xff < sVar4);
  *(char *)((long)this->_color_u16 + 4) =
       (0 < sVar5) * (sVar5 < 0x100) * auVar22[8] - (0xff < sVar5);
  *(char *)((long)this->_color_u16 + 5) =
       (0 < sVar6) * (sVar6 < 0x100) * auVar22[10] - (0xff < sVar6);
  *(char *)((long)this->_color_u16 + 6) =
       (0 < sVar7) * (sVar7 < 0x100) * auVar22[0xc] - (0xff < sVar7);
  *(char *)((long)this->_color_u16 + 7) =
       (0 < sVar8) * (sVar8 < 0x100) * auVar22[0xe] - (0xff < sVar8);
  *(char *)(this->_color_u16 + 1) = (0 < sVar1) * (sVar1 < 0x100) * auVar22[0] - (0xff < sVar1);
  *(char *)((long)this->_color_u16 + 9) =
       (0 < sVar2) * (sVar2 < 0x100) * auVar22[2] - (0xff < sVar2);
  *(char *)((long)this->_color_u16 + 10) =
       (0 < sVar3) * (sVar3 < 0x100) * auVar22[4] - (0xff < sVar3);
  *(char *)((long)this->_color_u16 + 0xb) =
       (0 < sVar4) * (sVar4 < 0x100) * auVar22[6] - (0xff < sVar4);
  *(char *)((long)this->_color_u16 + 0xc) =
       (0 < sVar5) * (sVar5 < 0x100) * auVar22[8] - (0xff < sVar5);
  *(char *)((long)this->_color_u16 + 0xd) =
       (0 < sVar6) * (sVar6 < 0x100) * auVar22[10] - (0xff < sVar6);
  *(char *)((long)this->_color_u16 + 0xe) =
       (0 < sVar7) * (sVar7 < 0x100) * auVar22[0xc] - (0xff < sVar7);
  *(char *)((long)this->_color_u16 + 0xf) =
       (0 < sVar8) * (sVar8 < 0x100) * auVar22[0xe] - (0xff < sVar8);
  auVar22 = ZEXT416((uint)(iVar20 * 0x1f9) / 1000 + iVar20 * 0x40);
  auVar22 = pshuflw(auVar22,auVar22,0);
  uVar21 = auVar22._0_4_;
  *(undefined4 *)this->_alpha_u16 = uVar21;
  *(undefined4 *)((long)this->_alpha_u16 + 4) = uVar21;
  *(undefined4 *)(this->_alpha_u16 + 1) = uVar21;
  *(undefined4 *)((long)this->_alpha_u16 + 0xc) = uVar21;
  *&(this->_components).components = components.components;
  return;
}

Assistant:

blender_solid_color::blender_solid_color(pixel components, uint8_t alpha)
			: _color_u16(make_color_u16(components)), _alpha_u16(make_alpha_u16(alpha)), _components(components)
		{	}